

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_int>::test_small_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  int32_t i;
  int32_t small_stop;
  uint in_stack_00000028;
  uint in_stack_0000002c;
  DivideTest<unsigned_int> *in_stack_00000030;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    test_one<(libdivide::Branching)1>
              (in_stack_00000030,in_stack_0000002c,in_stack_00000028,
               (divider<unsigned_int,_(libdivide::Branching)1> *)this);
  }
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }